

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refutils.cc
# Opt level: O0

void lf::refinement::WriteMatlabLevel(MeshHierarchy *hier_mesh,size_type level,string *filename)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *pvVar7;
  element_type *peVar8;
  const_reference pvVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  const_reference pvVar10;
  uint local_280;
  int k_2;
  size_type no_cells;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ref_eds;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *cell_parent_info;
  int k_1;
  size_type no_edges;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *ed_parent_info;
  int k;
  size_type no_nodes;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *pt_parent_info;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  ostream local_228 [8];
  ofstream file;
  size_type fn_len;
  string *filename_local;
  size_type level_local;
  MeshHierarchy *hier_mesh_local;
  
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (filename);
  uVar2 = (uint)sVar4;
  if (((1 < uVar2) &&
      (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[](filename,(ulong)(uVar2 - 2)), *pvVar5 != '.')) &&
     (pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](filename,(ulong)(uVar2 - 1)), *pvVar5 != 'm')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (filename,".m");
  }
  std::ofstream::ofstream(local_228,(string *)filename,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (filename);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (filename);
    poVar6 = std::operator<<(local_228,"function [PTPAR,EDPAR,CELLPAR] = ");
    poVar6 = std::operator<<(poVar6,(string *)filename);
    poVar6 = std::operator<<(poVar6,"()");
    std::operator<<(poVar6,'\n');
    poVar6 = std::operator<<(local_228,"% Parent data for a hybid 2D mesh");
    std::operator<<(poVar6,'\n');
    MeshHierarchy::getMesh((MeshHierarchy *)&pt_parent_info,(size_type)hier_mesh);
    pvVar7 = MeshHierarchy::ParentInfos(hier_mesh,level,2);
    peVar8 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pt_parent_info);
    uVar2 = (*peVar8->_vptr_Mesh[3])(peVar8,2);
    for (ed_parent_info._0_4_ = 0; (uint)ed_parent_info < uVar2;
        ed_parent_info._0_4_ = (uint)ed_parent_info + 1) {
      poVar6 = std::operator<<(local_228,"PTPAR(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)ed_parent_info + 1);
      poVar6 = std::operator<<(poVar6,",:) = [");
      pvVar9 = std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
               ::operator[](pvVar7,(long)(int)(uint)ed_parent_info);
      iVar3 = normalize_idx(pvVar9->parent_index);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6," , ");
      pvVar9 = std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
               ::operator[](pvVar7,(long)(int)(uint)ed_parent_info);
      iVar3 = normalize_idx(pvVar9->child_number);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6,"];");
      std::operator<<(poVar6,'\n');
    }
    pvVar7 = MeshHierarchy::ParentInfos(hier_mesh,level,1);
    peVar8 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pt_parent_info);
    uVar2 = (*peVar8->_vptr_Mesh[3])(peVar8,1);
    for (cell_parent_info._0_4_ = 0; (uint)cell_parent_info < uVar2;
        cell_parent_info._0_4_ = (uint)cell_parent_info + 1) {
      poVar6 = std::operator<<(local_228,"EDPAR(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)cell_parent_info + 1);
      poVar6 = std::operator<<(poVar6,",:) = [");
      pvVar9 = std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
               ::operator[](pvVar7,(long)(int)(uint)cell_parent_info);
      iVar3 = normalize_idx(pvVar9->parent_index);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6," , ");
      pvVar9 = std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
               ::operator[](pvVar7,(long)(int)(uint)cell_parent_info);
      iVar3 = normalize_idx(pvVar9->child_number);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6,"];");
      std::operator<<(poVar6,'\n');
    }
    pvVar7 = MeshHierarchy::ParentInfos(hier_mesh,level,0);
    this = MeshHierarchy::RefinementEdges(hier_mesh,level);
    peVar8 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pt_parent_info);
    uVar2 = (*peVar8->_vptr_Mesh[3])(peVar8,0);
    for (local_280 = 0; local_280 < uVar2; local_280 = local_280 + 1) {
      poVar6 = std::operator<<(local_228,"CELLPAR(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_280 + 1);
      poVar6 = std::operator<<(poVar6,",:) = [");
      pvVar9 = std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
               ::operator[](pvVar7,(long)(int)local_280);
      iVar3 = normalize_idx(pvVar9->parent_index);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6," , ");
      pvVar9 = std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
               ::operator[](pvVar7,(long)(int)local_280);
      iVar3 = normalize_idx(pvVar9->child_number);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6," , ");
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (this,(long)(int)local_280);
      iVar3 = normalize_idx(*pvVar10);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6," ];");
      std::operator<<(poVar6,'\n');
    }
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<const_lf::mesh::Mesh> *)&pt_parent_info);
  }
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void WriteMatlabLevel(const MeshHierarchy &hier_mesh, size_type level,
                      std::string filename) {
  // Preprocess filename: append .m, if not there already
  {
    const size_type fn_len = filename.size();
    if ((fn_len > 1) && (filename[fn_len - 2] != '.') &&
        (filename[fn_len - 1] != 'm')) {
      filename += ".m";
    }
  }
  // Open file for writing
  std::ofstream file(filename);
  if (file.is_open()) {
    // Start regular writing operations
    // Remove trailing .m
    filename.pop_back();
    filename.pop_back();
    file << "function [PTPAR,EDPAR,CELLPAR] = " << filename << "()" << '\n';
    file << "% Parent data for a hybid 2D mesh" << '\n';

    // Mesh on the selected level
    const std::shared_ptr<const mesh::Mesh> mesh = hier_mesh.getMesh(level);
    {
      // Output parent information for nodes
      const std::vector<ParentInfo> &pt_parent_info(
          hier_mesh.ParentInfos(level, 2));
      const size_type no_nodes = mesh->NumEntities(2);
      for (int k = 0; k < no_nodes; k++) {
        file << "PTPAR(" << k + 1 << ",:) = ["
             << normalize_idx(pt_parent_info[k].parent_index) << " , "
             << normalize_idx(pt_parent_info[k].child_number) << "];" << '\n';
      }
    }

    {
      // Output parent information for edge
      const std::vector<ParentInfo> &ed_parent_info(
          hier_mesh.ParentInfos(level, 1));
      const size_type no_edges = mesh->NumEntities(1);
      for (int k = 0; k < no_edges; k++) {
        file << "EDPAR(" << k + 1 << ",:) = ["
             << normalize_idx(ed_parent_info[k].parent_index) << " , "
             << normalize_idx(ed_parent_info[k].child_number) << "];" << '\n';
      }
    }

    {
      // Output parent information for cells
      const std::vector<ParentInfo> &cell_parent_info(
          hier_mesh.ParentInfos(level, 0));
      const std::vector<glb_idx_t> &ref_eds(hier_mesh.RefinementEdges(level));
      const size_type no_cells = mesh->NumEntities(0);
      for (int k = 0; k < no_cells; k++) {
        file << "CELLPAR(" << k + 1 << ",:) = ["
             << normalize_idx(cell_parent_info[k].parent_index) << " , "
             << normalize_idx(cell_parent_info[k].child_number) << " , "
             << normalize_idx(ref_eds[k]) << " ];" << '\n';
      }
    }
  }
}